

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

shared_ptr<ONX_Model> __thiscall ONX_ModelTest::ReadWriteReadModel(ONX_ModelTest *this)

{
  long lVar1;
  long lVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<ONX_Model> sVar3;
  shared_ptr<ONX_Model> source_model;
  __shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,(__shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0xf0));
  if (local_28._M_ptr != (element_type *)0x0) {
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 0x10) {
      lVar1 = *(long *)(in_RSI + 0x100 + lVar2);
      if ((lVar1 != 0) && (*(int *)(lVar1 + 8) == (local_28._M_ptr)->m_3dm_file_version)) {
        std::__shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + lVar2 + 0x100));
        goto LAB_00489d21;
      }
    }
  }
  *(undefined8 *)this = 0;
  (this->m_source_3dm_file_path).m_s = (wchar_t *)0x0;
LAB_00489d21:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  sVar3.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ONX_Model>)sVar3.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ONX_Model> ONX_ModelTest::ReadWriteReadModel() const
{
  const auto source_model = SourceModel();
  if (nullptr != source_model)
  {
    for (int i = 1; i < 3; i++)
    {
      const ONX_Model* copy_model = m_model[i].get();
      if (nullptr == copy_model)
        continue;
      if (copy_model->m_3dm_file_version != source_model->m_3dm_file_version)
        continue;
      return m_model[i];
    }
  }
  std::shared_ptr<ONX_Model> nullsp;
  return nullsp;
}